

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddTxSign(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                int hash_type,char *sign_data_hex,bool use_der_encode,int sighash_type,
                bool sighash_anyone_can_pay,bool clear_stack,char **tx_string)

{
  bool bVar1;
  AddressType AVar2;
  char *pcVar3;
  CfdException *pCVar4;
  uint uVar5;
  allocator local_1f2;
  bool is_bitcoin;
  SigHashType sighashtype;
  OutPoint outpoint;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  TransactionContext tx;
  SigHashType local_c0;
  SigHashType local_b4;
  SignParameter param;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x614;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d47;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&param);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    if (tx_string == (char **)0x0) {
      tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)0x4fe2f6;
      tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x620;
      tx.super_Transaction.vin_.
      super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d47;
      cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx output is null.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&tx,"Failed to parameter. tx output is null.",(allocator *)&param);
      cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    AVar2 = cfd::capi::ConvertHashToAddressType(hash_type);
    if (sign_data_hex != (char *)0x0) {
      bVar1 = cfd::capi::IsEmptyString(sign_data_hex);
      uVar5 = AVar2 - kP2wshAddress;
      if (uVar5 < 0xfffffffe && !use_der_encode || !bVar1) {
        cfd::SignParameter::SignParameter(&param);
        if (use_der_encode) {
          cfd::core::SigHashType::Create
                    (&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
          std::__cxx11::string::string((string *)&tx,sign_data_hex,(allocator *)&sign_list);
          cfd::core::ByteData::ByteData((ByteData *)&outpoint,(string *)&tx);
          std::__cxx11::string::~string((string *)&tx);
          cfd::core::SigHashType::SigHashType(&local_b4,&sighashtype);
          cfd::SignParameter::SignParameter
                    ((SignParameter *)&tx,(ByteData *)&outpoint,true,&local_b4);
          cfd::SignParameter::operator=(&param,(SignParameter *)&tx);
          cfd::SignParameter::~SignParameter((SignParameter *)&tx);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint);
        }
        else {
          std::__cxx11::string::string((string *)&outpoint,sign_data_hex,(allocator *)&sighashtype);
          cfd::core::SigHashType::SigHashType(&local_c0,kSigHashAll,false,false);
          cfd::SignParameter::SignParameter
                    ((SignParameter *)&tx,(string *)&outpoint,false,&local_c0);
          cfd::SignParameter::operator=(&param,(SignParameter *)&tx);
          cfd::SignParameter::~SignParameter((SignParameter *)&tx);
          std::__cxx11::string::~string((string *)&outpoint);
        }
        sign_list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sign_list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sign_list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                  (&sign_list,&param);
        is_bitcoin = false;
        cfd::capi::ConvertNetType(net_type,&is_bitcoin);
        std::__cxx11::string::string((string *)&sighashtype,txid,&local_1f2);
        cfd::core::Txid::Txid((Txid *)&tx,(string *)&sighashtype);
        cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&tx,vout);
        cfd::core::Txid::~Txid((Txid *)&tx);
        std::__cxx11::string::~string((string *)&sighashtype);
        if (is_bitcoin == true) {
          std::__cxx11::string::string((string *)&sighashtype,tx_hex_string,&local_1f2);
          cfd::TransactionContext::TransactionContext(&tx,(string *)&sighashtype);
          std::__cxx11::string::~string((string *)&sighashtype);
          cfd::TransactionContext::AddSign(&tx,&outpoint,&sign_list,uVar5 < 0xfffffffe,clear_stack);
          cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                    ((string *)&sighashtype,(AbstractTransaction *)&tx);
          pcVar3 = cfd::capi::CreateString((string *)&sighashtype);
          *tx_string = pcVar3;
          std::__cxx11::string::~string((string *)&sighashtype);
          cfd::TransactionContext::~TransactionContext(&tx);
        }
        else {
          std::__cxx11::string::string((string *)&sighashtype,tx_hex_string,&local_1f2);
          cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                    ((ConfidentialTransactionContext *)&tx,(string *)&sighashtype);
          std::__cxx11::string::~string((string *)&sighashtype);
          cfd::ConfidentialTransactionContext::AddSign
                    ((ConfidentialTransactionContext *)&tx,&outpoint,&sign_list,uVar5 < 0xfffffffe,
                     clear_stack);
          cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                    ((string *)&sighashtype,(AbstractTransaction *)&tx);
          pcVar3 = cfd::capi::CreateString((string *)&sighashtype);
          *tx_string = pcVar3;
          std::__cxx11::string::~string((string *)&sighashtype);
          cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                    ((ConfidentialTransactionContext *)&tx);
        }
        cfd::core::Txid::~Txid(&outpoint.txid_);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&sign_list);
        cfd::SignParameter::~SignParameter(&param);
        return 0;
      }
    }
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x62f;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d47;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"sign data is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. sign data is null or empty.",(allocator *)&param)
    ;
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4fe2f6;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x61a;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d47;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"txid is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. txid is null or empty.",(allocator *)&param);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTxSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* sign_data_hex,
    bool use_der_encode, int sighash_type, bool sighash_anyone_can_pay,
    bool clear_stack, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    if ((sign_data_hex == nullptr) ||
        (IsEmptyString(sign_data_hex) && (use_der_encode || !is_witness))) {
      warn(CFD_LOG_SOURCE, "sign data is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sign data is null or empty.");
    }

    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(sign_data_hex));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(sign_data_hex));
    }
    std::vector<SignParameter> sign_list;
    sign_list.push_back(param);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddSign(outpoint, sign_list, is_witness, clear_stack);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddSign(outpoint, sign_list, is_witness, clear_stack);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}